

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_op.cc
# Opt level: O0

Nonnull<const_char_*> __thiscall
absl::lts_20250127::log_internal::CheckOpMessageBuilder::NewString(CheckOpMessageBuilder *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ptr;
  Nonnull<const_char_*> pcVar1;
  CheckOpMessageBuilder *this_local;
  
  std::operator<<((ostream *)this,")");
  ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  std::__cxx11::ostringstream::str();
  IgnoreLeak<std::__cxx11::string>(ptr);
  pcVar1 = (Nonnull<const_char_*>)std::__cxx11::string::c_str();
  return pcVar1;
}

Assistant:

absl::Nonnull<const char*> CheckOpMessageBuilder::NewString() {
  stream_ << ")";
  // There's no need to free this string since the process is crashing.
  return absl::IgnoreLeak(new std::string(std::move(stream_).str()))->c_str();
}